

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSegment.cpp
# Opt level: O0

void __thiscall
ServerSegment::ServerSegment
          (ServerSegment *this,byte4 seqNumber,byte finFlag,byte *data,byte4 ackNumber,byte ackFlag,
          byte2 checksum,byte2 reserved)

{
  size_t sVar1;
  byte ackFlag_local;
  byte4 ackNumber_local;
  byte *data_local;
  byte finFlag_local;
  byte4 seqNumber_local;
  ServerSegment *this_local;
  
  this->sequenceNumber = seqNumber;
  this->ackNumber = ackNumber;
  this->ackFlag = ackFlag;
  this->finFlag = finFlag;
  sVar1 = strlen((char *)data);
  this->length = (byte2)sVar1;
  this->checksum = checksum;
  this->reserved = reserved;
  this->data = data;
  return;
}

Assistant:

ServerSegment::ServerSegment(byte4 seqNumber, byte finFlag, byte *data, byte4 ackNumber, byte ackFlag, byte2 checksum, byte2 reserved) {
    this->sequenceNumber = seqNumber;
    this->ackNumber = ackNumber;
    this->ackFlag = ackFlag;
    this->finFlag = finFlag;
    this->length = strlen((char *) data);
    this->checksum = checksum;
    this->reserved = reserved;
    this->data = data;
}